

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_sha2.c
# Opt level: O0

void cmSHA512_Final(sha_byte *digest,SHA_CTX *context)

{
  ulong uVar1;
  sha_word64 tmp;
  sha_byte *psStack_20;
  int j;
  sha_word64 *d;
  SHA_CTX *context_local;
  sha_byte *digest_local;
  
  if (context == (SHA_CTX *)0x0) {
    __assert_fail("context != (SHA_CTX*)0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cm_sha2.c"
                  ,0x5d1,"void cmSHA512_Final(sha_byte *, SHA_CTX *)");
  }
  if (digest != (sha_byte *)0x0) {
    cmSHA512_Internal_Last(context);
    psStack_20 = digest;
    for (tmp._4_4_ = 0; tmp._4_4_ < 8; tmp._4_4_ = tmp._4_4_ + 1) {
      uVar1 = *(ulong *)((long)context + (long)tmp._4_4_ * 8);
      uVar1 = uVar1 >> 0x20 | uVar1 << 0x20;
      uVar1 = (uVar1 & 0xff00ff00ff00ff00) >> 8 | (uVar1 & 0xff00ff00ff00ff) << 8;
      *(ulong *)((long)context + (long)tmp._4_4_ * 8) =
           (uVar1 & 0xffff0000ffff0000) >> 0x10 | (uVar1 & 0xffff0000ffff) << 0x10;
      *(undefined8 *)psStack_20 = *(undefined8 *)((long)context + (long)tmp._4_4_ * 8);
      psStack_20 = psStack_20 + 8;
    }
  }
  memset(context,0,0xd0);
  return;
}

Assistant:

void SHA512_Final(sha_byte digest[], SHA_CTX* context) {
	sha_word64	*d = (sha_word64*)digest;

	/* Sanity check: */
	assert(context != (SHA_CTX*)0);

	/* If no digest buffer is passed, we don't bother doing this: */
	if (digest != (sha_byte*)0) {
		SHA512_Internal_Last(context);

		/* Save the hash data for output: */
#if BYTE_ORDER == LITTLE_ENDIAN
		{
			/* Convert TO host byte order */
			int	j;
			for (j = 0; j < (SHA512_DIGEST_LENGTH >> 3); j++) {
				REVERSE64(context->s512.state[j],context->s512.state[j]);
				*d++ = context->s512.state[j];
			}
		}
#else
		MEMCPY_BCOPY(d, context->s512.state, SHA512_DIGEST_LENGTH);
#endif
	}

	/* Zero out state data */
	MEMSET_BZERO(context, sizeof(*context));
}